

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# correlated_normal_dist.cc
# Opt level: O0

int main(void)

{
  double dVar1;
  parameter_type P;
  _Setprecision _Var2;
  ostream *poVar3;
  ostream *this;
  ostream *poVar4;
  ostream *this_00;
  correlated_normal_dist<double> *this_01;
  int i;
  vector<double,_std::allocator<double>_> x4;
  vector<double,_std::allocator<double>_> x3;
  vector<double,_std::allocator<double>_> x2;
  vector<double,_std::allocator<double>_> x1;
  lcg64 R;
  correlated_normal_dist<double> D;
  double sig [4] [4];
  int d;
  value_type *in_stack_fffffffffffffd48;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd50;
  double *in_stack_fffffffffffffd58;
  correlated_normal_dist<double> *in_stack_fffffffffffffd60;
  lcg64 *in_stack_fffffffffffffd68;
  correlated_normal_dist<double> *in_stack_fffffffffffffd70;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffda8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdb0;
  int local_15c;
  
  trng::correlated_normal_dist<double>::correlated_normal_dist<double_const*>
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,(double *)in_stack_fffffffffffffd50
            );
  P.b = (result_type)in_stack_fffffffffffffd50;
  P.a = (result_type)in_stack_fffffffffffffd48;
  trng::lcg64::lcg64((lcg64 *)0x101601,P);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x101610);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x10161d);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x10162a);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x101637);
  for (local_15c = 0; local_15c < 1000000; local_15c = local_15c + 1) {
    trng::correlated_normal_dist<double>::operator()
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    trng::correlated_normal_dist<double>::operator()
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    trng::correlated_normal_dist<double>::operator()
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    trng::correlated_normal_dist<double>::operator()
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  }
  _Var2 = std::setprecision(4);
  poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
  dVar1 = covariance(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar1);
  poVar3 = std::operator<<(poVar3,'\t');
  dVar1 = covariance(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar1);
  poVar3 = std::operator<<(poVar3,'\t');
  dVar1 = covariance(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar1);
  poVar3 = std::operator<<(poVar3,'\t');
  dVar1 = covariance(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar1);
  poVar3 = std::operator<<(poVar3,'\n');
  dVar1 = covariance(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar1);
  poVar3 = std::operator<<(poVar3,'\t');
  dVar1 = covariance(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar1);
  poVar3 = std::operator<<(poVar3,'\t');
  dVar1 = covariance(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar1);
  poVar3 = std::operator<<(poVar3,'\t');
  dVar1 = covariance(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar1);
  poVar3 = std::operator<<(poVar3,'\n');
  dVar1 = covariance(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar1);
  poVar3 = std::operator<<(poVar3,'\t');
  dVar1 = covariance(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar1);
  this = std::operator<<(poVar3,'\t');
  dVar1 = covariance((vector<double,_std::allocator<double>_> *)poVar3,
                     (vector<double,_std::allocator<double>_> *)this);
  poVar4 = (ostream *)std::ostream::operator<<(this,dVar1);
  poVar4 = std::operator<<(poVar4,'\t');
  dVar1 = covariance((vector<double,_std::allocator<double>_> *)poVar3,
                     (vector<double,_std::allocator<double>_> *)this);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar1);
  poVar4 = std::operator<<(poVar4,'\n');
  dVar1 = covariance((vector<double,_std::allocator<double>_> *)poVar3,
                     (vector<double,_std::allocator<double>_> *)this);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar1);
  poVar4 = std::operator<<(poVar4,'\t');
  dVar1 = covariance((vector<double,_std::allocator<double>_> *)poVar3,
                     (vector<double,_std::allocator<double>_> *)this);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar1);
  poVar4 = std::operator<<(poVar4,'\t');
  dVar1 = covariance((vector<double,_std::allocator<double>_> *)poVar3,
                     (vector<double,_std::allocator<double>_> *)this);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar1);
  this_00 = std::operator<<(poVar4,'\t');
  dVar1 = covariance((vector<double,_std::allocator<double>_> *)poVar3,
                     (vector<double,_std::allocator<double>_> *)this);
  this_01 = (correlated_normal_dist<double> *)std::ostream::operator<<(this_00,dVar1);
  std::operator<<((ostream *)this_01,'\n');
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)poVar4);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)poVar4);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)poVar4);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)poVar4);
  trng::correlated_normal_dist<double>::~correlated_normal_dist(this_01);
  return 0;
}

Assistant:

int main() {
  const int d{4};
  // covariance matrix
  const double sig[d][d]{{2.0, -0.5, 0.3, -0.3},
                         {-0.5, 3.0, -0.3, 0.3},
                         {0.3, -0.3, 1.0, -0.3},
                         {-0.3, 0.3, -0.3, 1.0}};
  trng::correlated_normal_dist<> D(&sig[0][0], &sig[d - 1][d - 1] + 1);
  trng::lcg64 R;

  std::vector<double> x1, x2, x3, x4;
  // generate 4-tuples of correlated normal variables
  for (int i{0}; i < 1000000; ++i) {
    x1.push_back(D(R));
    x2.push_back(D(R));
    x3.push_back(D(R));
    x4.push_back(D(R));
  }
  // print (empirical) covariance matrix
  std::cout << std::setprecision(4) << covariance(x1, x1) << '\t' << covariance(x1, x2) << '\t'
            << covariance(x1, x3) << '\t' << covariance(x1, x4) << '\n'
            << covariance(x2, x1) << '\t' << covariance(x2, x2) << '\t' << covariance(x2, x3)
            << '\t' << covariance(x2, x4) << '\n'
            << covariance(x3, x1) << '\t' << covariance(x3, x2) << '\t' << covariance(x3, x3)
            << '\t' << covariance(x3, x4) << '\n'
            << covariance(x4, x1) << '\t' << covariance(x4, x2) << '\t' << covariance(x4, x3)
            << '\t' << covariance(x4, x4) << '\n';
  return EXIT_SUCCESS;
}